

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

ON__UINT32 __thiscall
ON__LayerPerViewSettings::DataCRC(ON__LayerPerViewSettings *this,ON__UINT32 current_remainder)

{
  uint uVar1;
  ON__UINT32 OVar2;
  
  uVar1 = SettingsMask(this);
  if (uVar1 != 0) {
    if ((uVar1 & 1) != 0) {
      current_remainder = ON_CRC32(current_remainder,0x10,this);
    }
    if ((uVar1 & 2) != 0) {
      current_remainder = ON_CRC32(current_remainder,4,&this->m_color);
    }
    if ((uVar1 & 4) != 0) {
      current_remainder = ON_CRC32(current_remainder,4,&this->m_plot_color);
    }
    if ((uVar1 & 8) != 0) {
      current_remainder = ON_CRC32(current_remainder,8,&this->m_plot_weight_mm);
    }
    if ((uVar1 & 0x10) != 0) {
      current_remainder = ON_CRC32(current_remainder,1,&this->m_visible);
    }
    if (0x1f < uVar1) {
      OVar2 = ON_CRC32(current_remainder,1,&this->m_persistent_visibility);
      return OVar2;
    }
  }
  return current_remainder;
}

Assistant:

ON__UINT32 ON__LayerPerViewSettings::DataCRC(ON__UINT32 current_remainder) const
{
  const unsigned int settings_mask = SettingsMask();
  if ( 0 != settings_mask )
  {
    if ( 0 != (settings_mask & ON_Layer::per_viewport_id) )
      current_remainder = ON_CRC32(current_remainder,sizeof(m_viewport_id),&m_viewport_id);
    if ( 0 != (settings_mask & ON_Layer::per_viewport_color) )
      current_remainder = ON_CRC32(current_remainder,sizeof(m_color),&m_color);
    if ( 0 != (settings_mask & ON_Layer::per_viewport_plot_color) )
      current_remainder = ON_CRC32(current_remainder,sizeof(m_plot_color),&m_plot_color);
    if ( 0 != (settings_mask & ON_Layer::per_viewport_plot_weight) )
      current_remainder = ON_CRC32(current_remainder,sizeof(m_plot_weight_mm),&m_plot_weight_mm);
    if ( 0 != (settings_mask & ON_Layer::per_viewport_visible) )
      current_remainder = ON_CRC32(current_remainder,sizeof(m_visible),&m_visible);
    if ( 0 != (settings_mask & ON_Layer::per_viewport_persistent_visibility) )
      current_remainder = ON_CRC32(current_remainder,sizeof(m_persistent_visibility),&m_persistent_visibility);
  }
  return current_remainder;
}